

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t c4::base64_decode(char *param_1,ulong param_2,long param_3,ulong param_4)

{
  char cVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  char local_6a;
  char local_69;
  char local_59;
  char local_44;
  char local_43;
  char local_42;
  char local_41;
  
  if ((param_2 & 3) == 0) {
    if (param_2 != 0) {
      uVar4 = 0;
      do {
        cVar1 = param_1[uVar4];
        if (((long)cVar1 < 0) ||
           ((cVar1 != '=' && ((&detail::base64_char_to_sextet_)[cVar1] == -1)))) goto LAB_001c129d;
        uVar4 = uVar4 + 1;
      } while (param_2 != uVar4);
      goto LAB_001c0f4b;
    }
LAB_001c1157:
    uVar4 = 0;
    pcVar7 = param_1;
  }
  else {
LAB_001c129d:
    base64_decode();
LAB_001c0f4b:
    if ((param_2 & 3) == 0) {
      if (param_2 == 0) goto LAB_001c1157;
    }
    else {
      base64_decode();
    }
    uVar8 = 0;
    uVar4 = 2;
    do {
      uVar6 = uVar4;
      uVar4 = uVar6 - 2;
      pcVar7 = param_1 + uVar8;
      if ((param_1[uVar8 + 2] == '=') || (cVar1 = param_1[uVar8 + 3], cVar1 == '=')) {
        if (param_2 - 4 != uVar8) {
          base64_decode();
        }
        goto LAB_001c1193;
      }
      if (cVar1 < '\0') {
        base64_decode();
        cVar1 = local_69;
      }
      cVar1 = (&detail::base64_char_to_sextet_)[cVar1];
      cVar2 = param_1[uVar8 + 2];
      if (param_1[uVar8 + 2] < '\0') {
        base64_decode();
        cVar2 = local_6a;
      }
      cVar2 = (&detail::base64_char_to_sextet_)[cVar2];
      cVar3 = param_1[uVar8 + 1];
      if (param_1[uVar8 + 1] < '\0') {
        base64_decode();
        cVar3 = local_59;
      }
      cVar3 = (&detail::base64_char_to_sextet_)[cVar3];
      if (*pcVar7 < '\0') {
        base64_decode();
      }
      uVar9 = (int)cVar2 << 6 | (int)cVar1;
      uVar5 = (int)cVar3 << 0xc | uVar9;
      if (uVar4 < param_4) {
        *(byte *)(param_3 + -2 + uVar6) =
             (byte)(((uint)(byte)(&detail::base64_char_to_sextet_)[*pcVar7] << 0x12) >> 0x10) |
             (byte)(uVar5 >> 0x10);
      }
      if (uVar6 - 1 < param_4) {
        *(char *)(param_3 + -1 + uVar6) = (char)(uVar5 >> 8);
      }
      if (uVar6 < param_4) {
        *(char *)(param_3 + uVar6) = (char)uVar9;
      }
      uVar8 = uVar8 + 4;
      uVar4 = uVar6 + 3;
    } while (uVar8 < param_2);
    uVar4 = uVar6 + 1;
    pcVar7 = param_1 + uVar8;
  }
LAB_001c1193:
  param_1 = param_1 + param_2;
  if (pcVar7 != param_1) {
    if (pcVar7[2] == '=') {
      if (pcVar7 + 4 != param_1) {
        base64_decode();
      }
      if (pcVar7[3] != '=') {
        base64_decode();
      }
      cVar1 = pcVar7[1];
      if (pcVar7[1] < '\0') {
        base64_decode();
        cVar1 = local_41;
      }
      cVar1 = (&detail::base64_char_to_sextet_)[cVar1];
      if (*pcVar7 < '\0') {
        base64_decode();
      }
      if (uVar4 < param_4) {
        *(byte *)(param_3 + uVar4) =
             (byte)(((uint)(byte)(&detail::base64_char_to_sextet_)[*pcVar7] << 0x12) >> 0x10) |
             (byte)((uint)((int)cVar1 << 0xc) >> 0x10);
      }
      uVar4 = uVar4 + 1;
    }
    else if (pcVar7[3] == '=') {
      cVar1 = pcVar7[2];
      if (pcVar7 + 4 != param_1) {
        base64_decode();
        cVar1 = local_44;
      }
      if (cVar1 < '\0') {
        base64_decode();
        cVar1 = local_43;
      }
      cVar1 = (&detail::base64_char_to_sextet_)[cVar1];
      cVar2 = pcVar7[1];
      if (pcVar7[1] < '\0') {
        base64_decode();
        cVar2 = local_42;
      }
      cVar2 = (&detail::base64_char_to_sextet_)[cVar2];
      if (*pcVar7 < '\0') {
        base64_decode();
      }
      uVar5 = (int)cVar2 << 0xc | (int)cVar1 << 6;
      if (uVar4 < param_4) {
        *(byte *)(param_3 + uVar4) =
             (byte)(((uint)(byte)(&detail::base64_char_to_sextet_)[*pcVar7] << 0x12) >> 0x10) |
             (byte)(uVar5 >> 0x10);
      }
      if (uVar4 + 1 < param_4) {
        *(char *)(param_3 + uVar4 + 1) = (char)(uVar5 >> 8);
      }
      uVar4 = uVar4 + 2;
    }
  }
  return uVar4;
}

Assistant:

size_t base64_decode(csubstr encoded, blob data)
{
    #define c4append_(c) { if(wpos < data.len) { data.buf[wpos] = static_cast<c4::byte>(c); } ++wpos; }
    #define c4appendval_(c, shift)\
    {\
        C4_XASSERT(c >= 0);\
        C4_XASSERT(size_t(c) < sizeof(detail::base64_char_to_sextet_));\
        val |= static_cast<uint32_t>(detail::base64_char_to_sextet_[(c)]) << ((shift) * 6);\
    }

    C4_ASSERT(base64_valid(encoded));
    C4_CHECK(encoded.len % 4 == 0);
    size_t wpos = 0;  // the write position
    const char *C4_RESTRICT d = encoded.str;
    constexpr const uint32_t full_byte = 0xff;
    // process every quartet of input 6 bits --> triplet of output bytes
    for(size_t rpos = 0; rpos < encoded.len; rpos += 4, d += 4)
    {
        if(d[2] == '=' || d[3] == '=') // skip the last quartet if it is padded
        {
            C4_ASSERT(d + 4 == encoded.str + encoded.len);
            break;
        }
        uint32_t val = 0;
        c4appendval_(d[3], 0);
        c4appendval_(d[2], 1);
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
        c4append_((val >> (1 * 8)) & full_byte);
        c4append_((val           ) & full_byte);
    }
    // deal with the last quartet when it is padded
    if(d == encoded.str + encoded.len)
        return wpos;
    if(d[2] == '=') // 2 padding chars
    {
        C4_ASSERT(d + 4 == encoded.str + encoded.len);
        C4_ASSERT(d[3] == '=');
        uint32_t val = 0;
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
    }
    else if(d[3] == '=') // 1 padding char
    {
        C4_ASSERT(d + 4 == encoded.str + encoded.len);
        uint32_t val = 0;
        c4appendval_(d[2], 1);
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
        c4append_((val >> (1 * 8)) & full_byte);
    }
    return wpos;
    #undef c4append_
    #undef c4appendval_
}